

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void jpgd::DCT_Upsample::P_Q<7,_6>::calc(Matrix44 *P,Matrix44 *Q,jpgd_block_t *pSrc)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  Element_Type *pEVar45;
  Temp_Type X037;
  Temp_Type X036;
  Temp_Type X035;
  Temp_Type X034;
  Temp_Type X033;
  Temp_Type X032;
  Temp_Type X031;
  Temp_Type X030;
  Temp_Type X027;
  Temp_Type X026;
  Temp_Type X025;
  Temp_Type X024;
  Temp_Type X023;
  Temp_Type X022;
  Temp_Type X021;
  Temp_Type X020;
  Temp_Type X017;
  Temp_Type X016;
  Temp_Type X015;
  Temp_Type X014;
  Temp_Type X013;
  Temp_Type X012;
  Temp_Type X011;
  Temp_Type X010;
  Temp_Type X007;
  Temp_Type X006;
  Temp_Type X005;
  Temp_Type X004;
  Temp_Type X003;
  Temp_Type X002;
  Temp_Type X001;
  Temp_Type X000;
  jpgd_block_t *pSrc_local;
  Matrix44 *Q_local;
  Matrix44 *P_local;
  
  sVar1 = *pSrc;
  iVar33 = (int)pSrc[8];
  sVar2 = pSrc[0x10];
  iVar34 = (int)pSrc[0x18];
  sVar3 = pSrc[0x20];
  iVar35 = (int)pSrc[0x28];
  sVar4 = pSrc[0x30];
  sVar5 = pSrc[1];
  sVar6 = pSrc[3];
  sVar7 = pSrc[5];
  iVar36 = pSrc[9] * 0x1aa + pSrc[0xb] * 0x32a + pSrc[0xd] * -0x168 + 0x200 >> 10;
  sVar8 = pSrc[0x11];
  sVar9 = pSrc[0x13];
  sVar10 = pSrc[0x15];
  iVar37 = pSrc[0x19] * 0x1aa + pSrc[0x1b] * 0x32a + pSrc[0x1d] * -0x168 + 0x200 >> 10;
  sVar11 = pSrc[0x21];
  sVar12 = pSrc[0x23];
  sVar13 = pSrc[0x25];
  iVar38 = pSrc[0x29] * 0x1aa + pSrc[0x2b] * 0x32a + pSrc[0x2d] * -0x168 + 0x200 >> 10;
  sVar14 = pSrc[0x31];
  sVar15 = pSrc[0x33];
  sVar16 = pSrc[0x35];
  sVar17 = pSrc[4];
  iVar39 = (int)pSrc[0xc];
  sVar18 = pSrc[0x14];
  iVar40 = (int)pSrc[0x1c];
  sVar19 = pSrc[0x24];
  iVar41 = (int)pSrc[0x2c];
  sVar20 = pSrc[0x34];
  sVar21 = pSrc[1];
  sVar22 = pSrc[3];
  sVar23 = pSrc[5];
  iVar42 = pSrc[9] * 0x17 + pSrc[0xb] * -99 + pSrc[0xd] * 0x1f6 + 0x200 >> 10;
  sVar24 = pSrc[0x11];
  sVar25 = pSrc[0x13];
  sVar26 = pSrc[0x15];
  iVar43 = pSrc[0x19] * 0x17 + pSrc[0x1b] * -99 + pSrc[0x1d] * 0x1f6 + 0x200 >> 10;
  sVar27 = pSrc[0x21];
  sVar28 = pSrc[0x23];
  sVar29 = pSrc[0x25];
  iVar44 = pSrc[0x29] * 0x17 + pSrc[0x2b] * -99 + pSrc[0x2d] * 0x1f6 + 0x200 >> 10;
  sVar30 = pSrc[0x31];
  sVar31 = pSrc[0x33];
  sVar32 = pSrc[0x35];
  pEVar45 = Matrix44::at(P,0,0);
  *pEVar45 = (int)sVar1;
  pEVar45 = Matrix44::at(P,0,1);
  *pEVar45 = iVar33 * 0x1aa + iVar34 * 0x32a + iVar35 * -0x168 + 0x200 >> 10;
  pEVar45 = Matrix44::at(P,0,2);
  *pEVar45 = (int)sVar3;
  pEVar45 = Matrix44::at(P,0,3);
  *pEVar45 = iVar33 * 0x17 + iVar34 * -99 + iVar35 * 0x1f6 + 0x200 >> 10;
  pEVar45 = Matrix44::at(P,1,0);
  *pEVar45 = sVar5 * 0x1aa + sVar6 * 0x32a + sVar7 * -0x168 + 0x200 >> 10;
  pEVar45 = Matrix44::at(P,1,1);
  *pEVar45 = iVar36 * 0x1aa + iVar37 * 0x32a + iVar38 * -0x168 + 0x200 >> 10;
  pEVar45 = Matrix44::at(P,1,2);
  *pEVar45 = sVar11 * 0x1aa + sVar12 * 0x32a + sVar13 * -0x168 + 0x200 >> 10;
  pEVar45 = Matrix44::at(P,1,3);
  *pEVar45 = iVar36 * 0x17 + iVar37 * -99 + iVar38 * 0x1f6 + 0x200 >> 10;
  pEVar45 = Matrix44::at(P,2,0);
  *pEVar45 = (int)sVar17;
  pEVar45 = Matrix44::at(P,2,1);
  *pEVar45 = iVar39 * 0x1aa + iVar40 * 0x32a + iVar41 * -0x168 + 0x200 >> 10;
  pEVar45 = Matrix44::at(P,2,2);
  *pEVar45 = (int)sVar19;
  pEVar45 = Matrix44::at(P,2,3);
  *pEVar45 = iVar39 * 0x17 + iVar40 * -99 + iVar41 * 0x1f6 + 0x200 >> 10;
  pEVar45 = Matrix44::at(P,3,0);
  *pEVar45 = sVar21 * 0x17 + sVar22 * -99 + sVar23 * 0x1f6 + 0x200 >> 10;
  pEVar45 = Matrix44::at(P,3,1);
  *pEVar45 = iVar42 * 0x1aa + iVar43 * 0x32a + iVar44 * -0x168 + 0x200 >> 10;
  pEVar45 = Matrix44::at(P,3,2);
  *pEVar45 = sVar27 * 0x17 + sVar28 * -99 + sVar29 * 0x1f6 + 0x200 >> 10;
  pEVar45 = Matrix44::at(P,3,3);
  *pEVar45 = iVar42 * 0x17 + iVar43 * -99 + iVar44 * 0x1f6 + 0x200 >> 10;
  pEVar45 = Matrix44::at(Q,0,0);
  *pEVar45 = iVar33 * 0x3a0 + iVar34 * -0x145 + iVar35 * 0xda + 0x200 >> 10;
  pEVar45 = Matrix44::at(Q,0,1);
  *pEVar45 = (int)sVar2;
  pEVar45 = Matrix44::at(Q,0,2);
  *pEVar45 = iVar33 * -0x4b + iVar34 * 0x20e + iVar35 * 0x313 + 0x200 >> 10;
  pEVar45 = Matrix44::at(Q,0,3);
  *pEVar45 = (int)sVar4;
  pEVar45 = Matrix44::at(Q,1,0);
  *pEVar45 = iVar36 * 0x3a0 + iVar37 * -0x145 + iVar38 * 0xda + 0x200 >> 10;
  pEVar45 = Matrix44::at(Q,1,1);
  *pEVar45 = sVar8 * 0x1aa + sVar9 * 0x32a + sVar10 * -0x168 + 0x200 >> 10;
  pEVar45 = Matrix44::at(Q,1,2);
  *pEVar45 = iVar36 * -0x4b + iVar37 * 0x20e + iVar38 * 0x313 + 0x200 >> 10;
  pEVar45 = Matrix44::at(Q,1,3);
  *pEVar45 = sVar14 * 0x1aa + sVar15 * 0x32a + sVar16 * -0x168 + 0x200 >> 10;
  pEVar45 = Matrix44::at(Q,2,0);
  *pEVar45 = iVar39 * 0x3a0 + iVar40 * -0x145 + iVar41 * 0xda + 0x200 >> 10;
  pEVar45 = Matrix44::at(Q,2,1);
  *pEVar45 = (int)sVar18;
  pEVar45 = Matrix44::at(Q,2,2);
  *pEVar45 = iVar39 * -0x4b + iVar40 * 0x20e + iVar41 * 0x313 + 0x200 >> 10;
  pEVar45 = Matrix44::at(Q,2,3);
  *pEVar45 = (int)sVar20;
  pEVar45 = Matrix44::at(Q,3,0);
  *pEVar45 = iVar42 * 0x3a0 + iVar43 * -0x145 + iVar44 * 0xda + 0x200 >> 10;
  pEVar45 = Matrix44::at(Q,3,1);
  *pEVar45 = sVar24 * 0x17 + sVar25 * -99 + sVar26 * 0x1f6 + 0x200 >> 10;
  pEVar45 = Matrix44::at(Q,3,2);
  *pEVar45 = iVar42 * -0x4b + iVar43 * 0x20e + iVar44 * 0x313 + 0x200 >> 10;
  pEVar45 = Matrix44::at(Q,3,3);
  *pEVar45 = sVar30 * 0x17 + sVar31 * -99 + sVar32 * 0x1f6 + 0x200 >> 10;
  return;
}

Assistant:

static void calc(Matrix44& P, Matrix44& Q, const jpgd_block_t* pSrc)
    {
      // 4x8 = 4x8 times 8x8, matrix 0 is constant
      const Temp_Type X000 = AT(0, 0);
      const Temp_Type X001 = AT(0, 1);
      const Temp_Type X002 = AT(0, 2);
      const Temp_Type X003 = AT(0, 3);
      const Temp_Type X004 = AT(0, 4);
      const Temp_Type X005 = AT(0, 5);
      const Temp_Type X006 = AT(0, 6);
      const Temp_Type X007 = AT(0, 7);
      const Temp_Type X010 = D(F(0.415735f) * AT(1, 0) + F(0.791065f) * AT(3, 0) + F(-0.352443f) * AT(5, 0) + F(0.277785f) * AT(7, 0));
      const Temp_Type X011 = D(F(0.415735f) * AT(1, 1) + F(0.791065f) * AT(3, 1) + F(-0.352443f) * AT(5, 1) + F(0.277785f) * AT(7, 1));
      const Temp_Type X012 = D(F(0.415735f) * AT(1, 2) + F(0.791065f) * AT(3, 2) + F(-0.352443f) * AT(5, 2) + F(0.277785f) * AT(7, 2));
      const Temp_Type X013 = D(F(0.415735f) * AT(1, 3) + F(0.791065f) * AT(3, 3) + F(-0.352443f) * AT(5, 3) + F(0.277785f) * AT(7, 3));
      const Temp_Type X014 = D(F(0.415735f) * AT(1, 4) + F(0.791065f) * AT(3, 4) + F(-0.352443f) * AT(5, 4) + F(0.277785f) * AT(7, 4));
      const Temp_Type X015 = D(F(0.415735f) * AT(1, 5) + F(0.791065f) * AT(3, 5) + F(-0.352443f) * AT(5, 5) + F(0.277785f) * AT(7, 5));
      const Temp_Type X016 = D(F(0.415735f) * AT(1, 6) + F(0.791065f) * AT(3, 6) + F(-0.352443f) * AT(5, 6) + F(0.277785f) * AT(7, 6));
      const Temp_Type X017 = D(F(0.415735f) * AT(1, 7) + F(0.791065f) * AT(3, 7) + F(-0.352443f) * AT(5, 7) + F(0.277785f) * AT(7, 7));
      const Temp_Type X020 = AT(4, 0);
      const Temp_Type X021 = AT(4, 1);
      const Temp_Type X022 = AT(4, 2);
      const Temp_Type X023 = AT(4, 3);
      const Temp_Type X024 = AT(4, 4);
      const Temp_Type X025 = AT(4, 5);
      const Temp_Type X026 = AT(4, 6);
      const Temp_Type X027 = AT(4, 7);
      const Temp_Type X030 = D(F(0.022887f) * AT(1, 0) + F(-0.097545f) * AT(3, 0) + F(0.490393f) * AT(5, 0) + F(0.865723f) * AT(7, 0));
      const Temp_Type X031 = D(F(0.022887f) * AT(1, 1) + F(-0.097545f) * AT(3, 1) + F(0.490393f) * AT(5, 1) + F(0.865723f) * AT(7, 1));
      const Temp_Type X032 = D(F(0.022887f) * AT(1, 2) + F(-0.097545f) * AT(3, 2) + F(0.490393f) * AT(5, 2) + F(0.865723f) * AT(7, 2));
      const Temp_Type X033 = D(F(0.022887f) * AT(1, 3) + F(-0.097545f) * AT(3, 3) + F(0.490393f) * AT(5, 3) + F(0.865723f) * AT(7, 3));
      const Temp_Type X034 = D(F(0.022887f) * AT(1, 4) + F(-0.097545f) * AT(3, 4) + F(0.490393f) * AT(5, 4) + F(0.865723f) * AT(7, 4));
      const Temp_Type X035 = D(F(0.022887f) * AT(1, 5) + F(-0.097545f) * AT(3, 5) + F(0.490393f) * AT(5, 5) + F(0.865723f) * AT(7, 5));
      const Temp_Type X036 = D(F(0.022887f) * AT(1, 6) + F(-0.097545f) * AT(3, 6) + F(0.490393f) * AT(5, 6) + F(0.865723f) * AT(7, 6));
      const Temp_Type X037 = D(F(0.022887f) * AT(1, 7) + F(-0.097545f) * AT(3, 7) + F(0.490393f) * AT(5, 7) + F(0.865723f) * AT(7, 7));

      // 4x4 = 4x8 times 8x4, matrix 1 is constant
      P.at(0, 0) = X000;
      P.at(0, 1) = D(X001 * F(0.415735f) + X003 * F(0.791065f) + X005 * F(-0.352443f) + X007 * F(0.277785f));
      P.at(0, 2) = X004;
      P.at(0, 3) = D(X001 * F(0.022887f) + X003 * F(-0.097545f) + X005 * F(0.490393f) + X007 * F(0.865723f));
      P.at(1, 0) = X010;
      P.at(1, 1) = D(X011 * F(0.415735f) + X013 * F(0.791065f) + X015 * F(-0.352443f) + X017 * F(0.277785f));
      P.at(1, 2) = X014;
      P.at(1, 3) = D(X011 * F(0.022887f) + X013 * F(-0.097545f) + X015 * F(0.490393f) + X017 * F(0.865723f));
      P.at(2, 0) = X020;
      P.at(2, 1) = D(X021 * F(0.415735f) + X023 * F(0.791065f) + X025 * F(-0.352443f) + X027 * F(0.277785f));
      P.at(2, 2) = X024;
      P.at(2, 3) = D(X021 * F(0.022887f) + X023 * F(-0.097545f) + X025 * F(0.490393f) + X027 * F(0.865723f));
      P.at(3, 0) = X030;
      P.at(3, 1) = D(X031 * F(0.415735f) + X033 * F(0.791065f) + X035 * F(-0.352443f) + X037 * F(0.277785f));
      P.at(3, 2) = X034;
      P.at(3, 3) = D(X031 * F(0.022887f) + X033 * F(-0.097545f) + X035 * F(0.490393f) + X037 * F(0.865723f));
      // 40 muls 24 adds

      // 4x4 = 4x8 times 8x4, matrix 1 is constant
      Q.at(0, 0) = D(X001 * F(0.906127f) + X003 * F(-0.318190f) + X005 * F(0.212608f) + X007 * F(-0.180240f));
      Q.at(0, 1) = X002;
      Q.at(0, 2) = D(X001 * F(-0.074658f) + X003 * F(0.513280f) + X005 * F(0.768178f) + X007 * F(-0.375330f));
      Q.at(0, 3) = X006;
      Q.at(1, 0) = D(X011 * F(0.906127f) + X013 * F(-0.318190f) + X015 * F(0.212608f) + X017 * F(-0.180240f));
      Q.at(1, 1) = X012;
      Q.at(1, 2) = D(X011 * F(-0.074658f) + X013 * F(0.513280f) + X015 * F(0.768178f) + X017 * F(-0.375330f));
      Q.at(1, 3) = X016;
      Q.at(2, 0) = D(X021 * F(0.906127f) + X023 * F(-0.318190f) + X025 * F(0.212608f) + X027 * F(-0.180240f));
      Q.at(2, 1) = X022;
      Q.at(2, 2) = D(X021 * F(-0.074658f) + X023 * F(0.513280f) + X025 * F(0.768178f) + X027 * F(-0.375330f));
      Q.at(2, 3) = X026;
      Q.at(3, 0) = D(X031 * F(0.906127f) + X033 * F(-0.318190f) + X035 * F(0.212608f) + X037 * F(-0.180240f));
      Q.at(3, 1) = X032;
      Q.at(3, 2) = D(X031 * F(-0.074658f) + X033 * F(0.513280f) + X035 * F(0.768178f) + X037 * F(-0.375330f));
      Q.at(3, 3) = X036;
      // 40 muls 24 adds
    }